

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.h
# Opt level: O1

void __thiscall
Assimp::FBX::
TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~TypedProperty(TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this)

{
  pointer pcVar1;
  
  (this->super_Property)._vptr_Property = (_func_int **)&PTR__TypedProperty_00259ab0;
  pcVar1 = (this->value)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->value).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

explicit TypedProperty(const T& value)
    : value(value) {
        // empty
    }